

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char[23],std::__cxx11::string,char[23],std::__cxx11::string,char[23],int,char[3],char_const*,char[4]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [23],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [23],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3,
                   char (*args_4) [23],int *args_5,char (*args_6) [3],char **args_7,
                   char (*args_8) [4])

{
  char *__s;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_110;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  size_t local_d0;
  char *pcStack_c8;
  size_t local_c0;
  char (*local_b8) [23];
  size_type local_b0;
  pointer local_a8;
  size_t local_a0;
  char (*local_98) [23];
  size_type local_90;
  pointer local_88;
  size_t local_80;
  char (*local_78) [23];
  size_t local_70;
  char *pcStack_68;
  size_t local_60;
  char (*local_58) [3];
  size_t local_50;
  char *local_48;
  size_t local_40;
  char (*local_38) [4];
  
  local_e0._M_len = (a->View_)._M_len;
  local_e0._M_str = (a->View_)._M_str;
  local_d0 = (b->View_)._M_len;
  pcStack_c8 = (b->View_)._M_str;
  local_c0 = strlen(*args);
  local_a8 = (args_1->_M_dataplus)._M_p;
  local_b0 = args_1->_M_string_length;
  local_b8 = args;
  local_a0 = strlen(*args_2);
  local_88 = (args_3->_M_dataplus)._M_p;
  local_90 = args_3->_M_string_length;
  local_98 = args_2;
  local_80 = strlen(*args_4);
  local_78 = args_4;
  cmAlphaNum::cmAlphaNum(&local_110,*args_5);
  local_70 = local_110.View_._M_len;
  pcStack_68 = local_110.View_._M_str;
  local_60 = strlen(*args_6);
  local_58 = args_6;
  __s = *args_7;
  local_50 = strlen(__s);
  local_48 = __s;
  local_40 = strlen(*args_8);
  local_38 = args_8;
  views._M_len = 0xb;
  views._M_array = &local_e0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}